

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QAbstractSlider::timerEvent(QAbstractSlider *this,QTimerEvent *e)

{
  SliderAction action;
  QAbstractSliderPrivate *this_00;
  int position;
  
  this_00 = *(QAbstractSliderPrivate **)&(this->super_QWidget).field_0x8;
  if (*(TimerId *)(e + 0x10) != (this_00->repeatActionTimer).m_id) {
    return;
  }
  if (this_00->repeatActionTime != 0) {
    QBasicTimer::start(&this_00->repeatActionTimer,this_00->repeatActionTime,(QObject *)this);
    this_00->repeatActionTime = 0;
  }
  action = this_00->repeatAction;
  if (action == SliderPageStepSub) {
    position = this_00->value - this_00->pageStep;
  }
  else {
    if (action != SliderPageStepAdd) {
      triggerAction(this,action);
      return;
    }
    position = this_00->value + this_00->pageStep;
  }
  QAbstractSliderPrivate::setAdjustedSliderPosition(this_00,position);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }